

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Binary_PutUvarint_Test::~Binary_PutUvarint_Test
          (Binary_PutUvarint_Test *this)

{
  Binary_PutUvarint_Test *this_local;
  
  ~Binary_PutUvarint_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Binary, PutUvarint) {
	multihash::Bytes buf{};
	multihash::Bytes expect{};
	multihash::Bytes actual{};
	int count{};

	// write simple byte
	buf.clear();
	buf.resize(binary::MaxVarintLen64);
	expect = multihash::Bytes{1};
	count = binary::putUvarint(buf, 0b00000001);
	actual = multihash::Bytes{buf.begin(), buf.begin() + count};
	EXPECT_EQ(expect, actual);
	EXPECT_EQ(1, count);

	// write value that requires two bytes
	buf.clear();
	buf.resize(binary::MaxVarintLen64);
	expect = multihash::Bytes{0b10000000, 0b00000001};
	count = binary::putUvarint(buf, 128);
	actual = multihash::Bytes{buf.begin(), buf.begin() + count};
	EXPECT_EQ(expect, actual);
	EXPECT_EQ(2, count);

	// write value that requires three bytes
	buf.clear();
	buf.resize(binary::MaxVarintLen64);
	expect = multihash::Bytes{0b10000000, 0b10000000, 0b00000001};
	count = binary::putUvarint(buf, 16384);
	actual = multihash::Bytes{buf.begin(), buf.begin() + count};
	EXPECT_EQ(expect, actual);
	EXPECT_EQ(3, count);

	// empty buffer
	buf = {};
	ASSERT_THROW(binary::putUvarint(buf, 123), std::out_of_range);
}